

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcFaceBound::~IfcFaceBound(IfcFaceBound *this)

{
  char *pcVar1;
  _func_int *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  p_Var2 = (this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper[-3];
  paVar3 = &(this->Orientation).field_2;
  pcVar1 = paVar3->_M_local_buf + (long)p_Var2;
  builtin_strncpy((char *)((long)paVar3 + (long)p_Var2 + -0x48),"hǋ",4);
  pcVar1[-0x44] = '\0';
  pcVar1[-0x43] = '\0';
  pcVar1[-0x42] = '\0';
  pcVar1[-0x41] = '\0';
  pcVar1[0x10] = -0x20;
  pcVar1[0x11] = -0x39;
  pcVar1[0x12] = -0x75;
  pcVar1[0x13] = '\0';
  pcVar1[0x14] = '\0';
  pcVar1[0x15] = '\0';
  pcVar1[0x16] = '\0';
  pcVar1[0x17] = '\0';
  pcVar1[-0x38] = -0x70;
  pcVar1[-0x37] = -0x39;
  pcVar1[-0x36] = -0x75;
  pcVar1[-0x35] = '\0';
  pcVar1[-0x34] = '\0';
  pcVar1[-0x33] = '\0';
  pcVar1[-0x32] = '\0';
  pcVar1[-0x31] = '\0';
  pcVar1[-0x28] = -0x48;
  pcVar1[-0x27] = -0x39;
  pcVar1[-0x26] = -0x75;
  pcVar1[-0x25] = '\0';
  pcVar1[-0x24] = '\0';
  pcVar1[-0x23] = '\0';
  pcVar1[-0x22] = '\0';
  pcVar1[-0x21] = '\0';
  if (*(char **)(pcVar1 + -0x10) != pcVar1) {
    operator_delete(*(char **)(pcVar1 + -0x10));
  }
  operator_delete((_func_int *)
                  ((long)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem
                          .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                          _vptr_ObjectHelper + (long)p_Var2));
  return;
}

Assistant:

IfcFaceBound() : Object("IfcFaceBound") {}